

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rand.cpp
# Opt level: O0

int __thiscall
ON_RandomNumberGenerator::RandomSignedInteger(ON_RandomNumberGenerator *this,int i0,int i1)

{
  int local_2c;
  ON__UINT32 local_28;
  int local_24;
  ON__UINT32 delta;
  ON__UINT32 r;
  int i1_local;
  int i0_local;
  ON_RandomNumberGenerator *this_local;
  
  local_28 = RandomNumber(this);
  if (i0 < i1) {
    local_24 = i1 - i0;
  }
  else {
    local_24 = i0 - i1;
  }
  if (local_24 != -1) {
    local_2c = i1;
    if (i0 < i1) {
      local_2c = i0;
    }
    local_28 = local_2c + local_28 % (local_24 + 1U);
  }
  return local_28;
}

Assistant:

int ON_RandomNumberGenerator::RandomSignedInteger(int i0, int i1)
{
  const ON__UINT32 r = RandomNumber();
  const ON__UINT32 delta = (i0 < i1) ? ((unsigned)(i1 - i0)) : ((unsigned)(i0 - i1));
  return
    (0xFFFFFFFFU == delta)
    ? ((int)r) // avoid delta+1 overflow and crash
    : (((i0 < i1) ? i0 : i1) + ((int)(r % (delta + 1U))))
    ;
}